

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* efsw::String::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,string *str,char *splitchar,bool *pushEmptyString)

{
  ulong uVar1;
  string tmpstr;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (str->_M_string_length != 0) {
    uVar1 = 0;
    do {
      if ((str->_M_dataplus)._M_p[uVar1] == *splitchar) {
        if ((*pushEmptyString != false) || ((char *)local_50._M_string_length != (char *)0x0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_50);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_50,0,(char *)local_50._M_string_length,0x1202ad);
        }
      }
      else {
        std::__cxx11::string::push_back((char)&local_50);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < str->_M_string_length);
  }
  if ((char *)local_50._M_string_length != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector < std::string > String::split ( const std::string& str, const char& splitchar, const bool& pushEmptyString )
{
	std::vector < std::string > tmp;
	std::string tmpstr;

	for ( size_t i = 0; i < str.size(); i++ )
	{
		if ( str[i] == splitchar )
		{
			if ( pushEmptyString || tmpstr.size() )
			{
				tmp.push_back(tmpstr);
				tmpstr = "";
			}
		}
		else
		{
			tmpstr += str[i];
		}
	}

	if ( tmpstr.size() )
	{
		tmp.push_back( tmpstr );
	}

	return tmp;
}